

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_file_reader.cc
# Opt level: O0

bool __thiscall
draco::StdioFileReader::ReadFileToBuffer
          (StdioFileReader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  size_t __n;
  uchar *__ptr;
  size_t sVar1;
  long in_RSI;
  long *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  size_t file_size;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  if (in_RSI == 0) {
    bVar2 = false;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x14ab73);
    __n = (**(code **)(*in_RDI + 0x20))();
    if (__n == 0) {
      fprintf(_stderr,"%s:%d (%s): %s.\n",
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]draco/src/draco/io/stdio_file_reader.cc"
              ,0x4c,"ReadFileToBuffer","Unable to obtain file size or file empty");
      bVar2 = false;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x14abde);
      sVar1 = fread(__ptr,1,__n,(FILE *)in_RDI[1]);
      bVar2 = sVar1 == __n;
    }
  }
  return bVar2;
}

Assistant:

bool StdioFileReader::ReadFileToBuffer(std::vector<uint8_t> *buffer) {
  if (buffer == nullptr) {
    return false;
  }
  buffer->clear();

  const size_t file_size = GetFileSize();
  if (file_size == 0) {
    FILEREADER_LOG_ERROR("Unable to obtain file size or file empty");
    return false;
  }

  buffer->resize(file_size);
  return fread(buffer->data(), 1, file_size, file_) == file_size;
}